

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  uint N;
  Token *pTVar1;
  int iVar2;
  char *pcVar3;
  u8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  uint local_7c;
  Token *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = pA;
  local_58[1] = pB;
  local_58[2] = pC;
  lVar7 = 0;
  local_7c = 0;
  do {
    pTVar1 = local_58[lVar7];
    if (pTVar1 == (Token *)0x0) break;
    N = pTVar1->n;
    puVar4 = &sqlite3JoinType::aKeyword[0].code;
    uVar6 = 0;
    do {
      if ((N == puVar4[-1]) &&
         (iVar2 = sqlite3_strnicmp(pTVar1->z,
                                   "naturaleftouterightfullinnercross" +
                                   ((anon_struct_3_3_0facdf6d *)(puVar4 + -2))->i,N), iVar2 == 0)) {
        local_7c = local_7c | *puVar4;
        bVar8 = 6 < uVar6;
        goto LAB_0016b1b5;
      }
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 3;
    } while (uVar6 != 7);
    bVar8 = true;
LAB_0016b1b5:
    if (bVar8) {
      local_7c = local_7c | 0x80;
      break;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if ((((local_7c & 0x38) == 0x20) || ((local_7c & 0x21) == 0x21)) || ((local_7c & 0x80) != 0)) {
    pcVar5 = " ";
    pcVar3 = " ";
    if (pB == (Token *)0x0) {
      pcVar3 = "";
    }
    if (pC == (Token *)0x0) {
      pcVar5 = "";
    }
    sqlite3ErrorMsg(pParse,"unknown join type: %T%s%T%s%T",pA,pcVar3,pB,pcVar5,pC);
    local_7c = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_7c;
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* (0) natural */ { 0,  7, JT_NATURAL                },
    /* (1) left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* (2) outer   */ { 10, 5, JT_OUTER                  },
    /* (3) right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* (4) full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* (5) inner   */ { 23, 5, JT_INNER                  },
    /* (6) cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0 ||
     (jointype & (JT_OUTER|JT_LEFT|JT_RIGHT))==JT_OUTER
  ){
    const char *zSp1 = " ";
    const char *zSp2 = " ";
    if( pB==0 ){ zSp1++; }
    if( pC==0 ){ zSp2++; }
    sqlite3ErrorMsg(pParse, "unknown join type: "
       "%T%s%T%s%T", pA, zSp1, pB, zSp2, pC);
    jointype = JT_INNER;
  }
  return jointype;
}